

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O1

void __thiscall
nlohmann::detail::
serializer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
::dump_escaped(serializer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
               *this,string_t *s,bool ensure_ascii)

{
  array<char,_512UL> *paVar1;
  char *pcVar2;
  byte bVar3;
  error_handler_t eVar4;
  element_type *peVar5;
  long lVar6;
  ulong extraout_RAX;
  long *plVar7;
  type_error *ptVar8;
  size_type *psVar9;
  byte bVar10;
  unsigned_long __val;
  uint uVar11;
  ulong unaff_R13;
  long lVar12;
  long lVar13;
  bool bVar14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  string local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  undefined1 local_68 [8];
  string sn;
  
  if (s->_M_string_length == 0) {
    bVar14 = true;
    lVar12 = 0;
  }
  else {
    paVar1 = &this->string_buffer;
    lVar12 = 0;
    __val = 0;
    lVar6 = 0;
    lVar13 = 0;
    bVar10 = 0;
    do {
      bVar3 = (s->_M_dataplus)._M_p[__val];
      if (bVar10 == 0) {
        uVar11 = 0xffU >> (serializer<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
                           ::decode(unsigned_char&,unsigned_int&,unsigned_char)::utf8d[bVar3] & 0x1f
                          ) & (uint)bVar3;
      }
      else {
        uVar11 = (int)unaff_R13 << 6 | bVar3 & 0x3f;
      }
      unaff_R13 = (ulong)uVar11;
      bVar10 = serializer<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
               ::decode(unsigned_char&,unsigned_int&,unsigned_char)::utf8d
               [(ulong)(byte)serializer<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
                             ::decode(unsigned_char&,unsigned_int&,unsigned_char)::utf8d[bVar3] +
                (ulong)bVar10 * 0x10 + 0x100];
      if (bVar10 == 1) {
        eVar4 = this->error_handler;
        if (1 < eVar4 - replace) {
          if (eVar4 == strict) {
            local_68 = (undefined1  [8])&sn._M_string_length;
            std::__cxx11::string::_M_construct((ulong)local_68,'\x03');
            snprintf((char *)local_68,(size_t)sn._M_dataplus._M_p,"%.2X",(ulong)bVar3);
            ptVar8 = (type_error *)__cxa_allocate_exception(0x20);
            std::__cxx11::to_string(&local_c8,__val);
            std::operator+(&local_e8,"invalid UTF-8 byte at index ",&local_c8);
            plVar7 = (long *)std::__cxx11::string::append((char *)&local_e8);
            local_a8._M_dataplus._M_p = (pointer)*plVar7;
            psVar9 = (size_type *)(plVar7 + 2);
            if ((size_type *)local_a8._M_dataplus._M_p == psVar9) {
              local_a8.field_2._M_allocated_capacity = *psVar9;
              local_a8.field_2._8_8_ = plVar7[3];
              local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
            }
            else {
              local_a8.field_2._M_allocated_capacity = *psVar9;
            }
            local_a8._M_string_length = plVar7[1];
            *plVar7 = (long)psVar9;
            plVar7[1] = 0;
            *(undefined1 *)(plVar7 + 2) = 0;
            std::operator+(&local_88,&local_a8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_68);
            type_error::create(ptVar8,0x13c,&local_88);
            __cxa_throw(ptVar8,&type_error::typeinfo,exception::~exception);
          }
          goto LAB_00138e66;
        }
        __val = (__val - 1) + (ulong)(lVar6 == 0);
        if (eVar4 == replace) {
          if (!ensure_ascii) {
            lVar12 = lVar13 + 3;
            pcVar2 = (this->string_buffer)._M_elems + lVar13;
            pcVar2[0] = -0x11;
            pcVar2[1] = -0x41;
            (this->string_buffer)._M_elems[lVar13 + 2] = -0x43;
            bVar10 = 0;
            lVar6 = 0;
            lVar13 = lVar12;
            goto LAB_00138e66;
          }
          builtin_strncpy((this->string_buffer)._M_elems + lVar13,"\\ufffd",6);
          lVar13 = lVar13 + 6;
        }
        bVar10 = 0;
LAB_00138e61:
        lVar6 = 0;
        lVar12 = lVar13;
      }
      else if (bVar10 == 0) {
        switch(uVar11) {
        case 8:
          pcVar2 = (this->string_buffer)._M_elems + lVar12;
          pcVar2[0] = '\\';
          pcVar2[1] = 'b';
          break;
        case 9:
          pcVar2 = (this->string_buffer)._M_elems + lVar12;
          pcVar2[0] = '\\';
          pcVar2[1] = 't';
          break;
        case 10:
          pcVar2 = (this->string_buffer)._M_elems + lVar12;
          pcVar2[0] = '\\';
          pcVar2[1] = 'n';
          break;
        case 0xb:
switchD_00138cee_caseD_b:
          if (uVar11 < 0x20 || ensure_ascii && 0x7e < uVar11) {
            sn.field_2._8_8_ = this;
            if (uVar11 < 0x10000) {
              snprintf(paVar1->_M_elems + lVar12,7,"\\u%04x",unaff_R13);
              lVar13 = lVar12 + 6;
              this = (serializer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                      *)sn.field_2._8_8_;
            }
            else {
              snprintf(paVar1->_M_elems + lVar12,0xd,"\\u%04x\\u%04x",
                       (ulong)((uVar11 >> 10) + 0xd7c0 & 0xffff),(ulong)(uVar11 & 0x3ff | 0xdc00));
              lVar13 = lVar12 + 0xc;
              this = (serializer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                      *)sn.field_2._8_8_;
            }
          }
          else {
            (this->string_buffer)._M_elems[lVar12] = bVar3;
            lVar13 = lVar12 + 1;
          }
          goto LAB_00138e27;
        case 0xc:
          pcVar2 = (this->string_buffer)._M_elems + lVar12;
          pcVar2[0] = '\\';
          pcVar2[1] = 'f';
          break;
        case 0xd:
          pcVar2 = (this->string_buffer)._M_elems + lVar12;
          pcVar2[0] = '\\';
          pcVar2[1] = 'r';
          break;
        default:
          if (uVar11 == 0x22) {
            pcVar2 = (this->string_buffer)._M_elems + lVar12;
            pcVar2[0] = '\\';
            pcVar2[1] = '\"';
          }
          else {
            if (uVar11 != 0x5c) goto switchD_00138cee_caseD_b;
            pcVar2 = (this->string_buffer)._M_elems + lVar12;
            pcVar2[0] = '\\';
            pcVar2[1] = '\\';
          }
        }
        lVar13 = lVar12 + 2;
LAB_00138e27:
        if (0xc < lVar13 - 500U) goto LAB_00138e61;
        peVar5 = (this->o).
                 super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        (*peVar5->_vptr_output_adapter_protocol[1])(peVar5,paVar1);
        lVar6 = 0;
        lVar13 = 0;
        lVar12 = 0;
      }
      else {
        if (!ensure_ascii) {
          (this->string_buffer)._M_elems[lVar12] = bVar3;
          lVar12 = lVar12 + 1;
        }
        lVar6 = lVar6 + 1;
      }
LAB_00138e66:
      __val = __val + 1;
    } while (__val < s->_M_string_length);
    bVar14 = bVar10 == 0;
  }
  if (bVar14) {
    if (lVar12 != 0) {
      peVar5 = (this->o).
               super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      (*peVar5->_vptr_output_adapter_protocol[1])(peVar5,&this->string_buffer,lVar12);
      return;
    }
  }
  else {
    serializer<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
    ::dump_escaped();
    if ((extraout_RAX & 1) == 0) {
      local_68 = (undefined1  [8])&sn._M_string_length;
      std::__cxx11::string::_M_construct((ulong)local_68,'\x03');
      snprintf((char *)local_68,(size_t)sn._M_dataplus._M_p,"%.2X",
               (ulong)(byte)(s->_M_dataplus)._M_p[s->_M_string_length - 1]);
      ptVar8 = (type_error *)__cxa_allocate_exception(0x20);
      std::operator+(&local_88,"incomplete UTF-8 string; last byte: 0x",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68);
      type_error::create(ptVar8,0x13c,&local_88);
      __cxa_throw(ptVar8,&type_error::typeinfo,exception::~exception);
    }
  }
  return;
}

Assistant:

void dump_escaped(const string_t& s, const bool ensure_ascii)
    {
        uint32_t codepoint;
        uint8_t state = UTF8_ACCEPT;
        std::size_t bytes = 0;  // number of bytes written to string_buffer

        // number of bytes written at the point of the last valid byte
        std::size_t bytes_after_last_accept = 0;
        std::size_t undumped_chars = 0;

        for (std::size_t i = 0; i < s.size(); ++i)
        {
            const auto byte = static_cast<uint8_t>(s[i]);

            switch (decode(state, codepoint, byte))
            {
                case UTF8_ACCEPT:  // decode found a new code point
                {
                    switch (codepoint)
                    {
                        case 0x08: // backspace
                        {
                            string_buffer[bytes++] = '\\';
                            string_buffer[bytes++] = 'b';
                            break;
                        }

                        case 0x09: // horizontal tab
                        {
                            string_buffer[bytes++] = '\\';
                            string_buffer[bytes++] = 't';
                            break;
                        }

                        case 0x0A: // newline
                        {
                            string_buffer[bytes++] = '\\';
                            string_buffer[bytes++] = 'n';
                            break;
                        }

                        case 0x0C: // formfeed
                        {
                            string_buffer[bytes++] = '\\';
                            string_buffer[bytes++] = 'f';
                            break;
                        }

                        case 0x0D: // carriage return
                        {
                            string_buffer[bytes++] = '\\';
                            string_buffer[bytes++] = 'r';
                            break;
                        }

                        case 0x22: // quotation mark
                        {
                            string_buffer[bytes++] = '\\';
                            string_buffer[bytes++] = '\"';
                            break;
                        }

                        case 0x5C: // reverse solidus
                        {
                            string_buffer[bytes++] = '\\';
                            string_buffer[bytes++] = '\\';
                            break;
                        }

                        default:
                        {
                            // escape control characters (0x00..0x1F) or, if
                            // ensure_ascii parameter is used, non-ASCII characters
                            if ((codepoint <= 0x1F) or (ensure_ascii and (codepoint >= 0x7F)))
                            {
                                if (codepoint <= 0xFFFF)
                                {
                                    (std::snprintf)(string_buffer.data() + bytes, 7, "\\u%04x",
                                                    static_cast<uint16_t>(codepoint));
                                    bytes += 6;
                                }
                                else
                                {
                                    (std::snprintf)(string_buffer.data() + bytes, 13, "\\u%04x\\u%04x",
                                                    static_cast<uint16_t>(0xD7C0 + (codepoint >> 10)),
                                                    static_cast<uint16_t>(0xDC00 + (codepoint & 0x3FF)));
                                    bytes += 12;
                                }
                            }
                            else
                            {
                                // copy byte to buffer (all previous bytes
                                // been copied have in default case above)
                                string_buffer[bytes++] = s[i];
                            }
                            break;
                        }
                    }

                    // write buffer and reset index; there must be 13 bytes
                    // left, as this is the maximal number of bytes to be
                    // written ("\uxxxx\uxxxx\0") for one code point
                    if (string_buffer.size() - bytes < 13)
                    {
                        o->write_characters(string_buffer.data(), bytes);
                        bytes = 0;
                    }

                    // remember the byte position of this accept
                    bytes_after_last_accept = bytes;
                    undumped_chars = 0;
                    break;
                }

                case UTF8_REJECT:  // decode found invalid UTF-8 byte
                {
                    switch (error_handler)
                    {
                        case error_handler_t::strict:
                        {
                            std::string sn(3, '\0');
                            (std::snprintf)(&sn[0], sn.size(), "%.2X", byte);
                            JSON_THROW(type_error::create(316, "invalid UTF-8 byte at index " + std::to_string(i) + ": 0x" + sn));
                        }

                        case error_handler_t::ignore:
                        case error_handler_t::replace:
                        {
                            // in case we saw this character the first time, we
                            // would like to read it again, because the byte
                            // may be OK for itself, but just not OK for the
                            // previous sequence
                            if (undumped_chars > 0)
                            {
                                --i;
                            }

                            // reset length buffer to the last accepted index;
                            // thus removing/ignoring the invalid characters
                            bytes = bytes_after_last_accept;

                            if (error_handler == error_handler_t::replace)
                            {
                                // add a replacement character
                                if (ensure_ascii)
                                {
                                    string_buffer[bytes++] = '\\';
                                    string_buffer[bytes++] = 'u';
                                    string_buffer[bytes++] = 'f';
                                    string_buffer[bytes++] = 'f';
                                    string_buffer[bytes++] = 'f';
                                    string_buffer[bytes++] = 'd';
                                }
                                else
                                {
                                    string_buffer[bytes++] = detail::binary_writer<BasicJsonType, char>::to_char_type('\xEF');
                                    string_buffer[bytes++] = detail::binary_writer<BasicJsonType, char>::to_char_type('\xBF');
                                    string_buffer[bytes++] = detail::binary_writer<BasicJsonType, char>::to_char_type('\xBD');
                                }
                                bytes_after_last_accept = bytes;
                            }

                            undumped_chars = 0;

                            // continue processing the string
                            state = UTF8_ACCEPT;
                            break;
                        }
                    }
                    break;
                }

                default:  // decode found yet incomplete multi-byte code point
                {
                    if (not ensure_ascii)
                    {
                        // code point will not be escaped - copy byte to buffer
                        string_buffer[bytes++] = s[i];
                    }
                    ++undumped_chars;
                    break;
                }
            }
        }

        // we finished processing the string
        if (JSON_LIKELY(state == UTF8_ACCEPT))
        {
            // write buffer
            if (bytes > 0)
            {
                o->write_characters(string_buffer.data(), bytes);
            }
        }
        else
        {
            // we finish reading, but do not accept: string was incomplete
            switch (error_handler)
            {
                case error_handler_t::strict:
                {
                    std::string sn(3, '\0');
                    (std::snprintf)(&sn[0], sn.size(), "%.2X", static_cast<uint8_t>(s.back()));
                    JSON_THROW(type_error::create(316, "incomplete UTF-8 string; last byte: 0x" + sn));
                }

                case error_handler_t::ignore:
                {
                    // write all accepted bytes
                    o->write_characters(string_buffer.data(), bytes_after_last_accept);
                    break;
                }

                case error_handler_t::replace:
                {
                    // write all accepted bytes
                    o->write_characters(string_buffer.data(), bytes_after_last_accept);
                    // add a replacement character
                    if (ensure_ascii)
                    {
                        o->write_characters("\\ufffd", 6);
                    }
                    else
                    {
                        o->write_characters("\xEF\xBF\xBD", 3);
                    }
                    break;
                }
            }
        }
    }